

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int aead_decrypt(st_ptls_traffic_protection_t *ctx,void *output,size_t *outlen,void *input,
                size_t inlen)

{
  int iVar1;
  size_t sVar2;
  uint8_t aad [5];
  undefined2 local_15;
  undefined1 local_13;
  undefined1 local_12;
  undefined1 local_11;
  
  local_15 = 0x317;
  local_13 = 3;
  local_12 = (undefined1)(inlen >> 8);
  local_11 = (undefined1)inlen;
  sVar2 = (*ctx->aead->do_decrypt)(ctx->aead,output,input,inlen,ctx->seq,&local_15,5);
  *outlen = sVar2;
  if (sVar2 == 0xffffffffffffffff) {
    iVar1 = 0x14;
  }
  else {
    ctx->seq = ctx->seq + 1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int aead_decrypt(struct st_ptls_traffic_protection_t *ctx, void *output, size_t *outlen, const void *input, size_t inlen)
{
    uint8_t aad[5];

    build_aad(aad, inlen);
    if ((*outlen = ptls_aead_decrypt(ctx->aead, output, input, inlen, ctx->seq, aad, sizeof(aad))) == SIZE_MAX)
        return PTLS_ALERT_BAD_RECORD_MAC;
    ++ctx->seq;
    return 0;
}